

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.h
# Opt level: O1

Variable<double> * yyml::nn::MM<double>(Variable<double> *va,Variable<double> *vb)

{
  int iVar1;
  Variable<double> *result;
  long lVar2;
  initializer_list<unsigned_long> __l;
  TensorShape shape;
  allocator_type local_51;
  unsigned_long local_50;
  unsigned_long local_48;
  TensorShape local_40;
  
  local_50 = *(va->values_).shape_.dims.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_48 = (vb->values_).shape_.dims.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[1];
  local_40.dim = 2;
  iVar1 = 1;
  lVar2 = 0;
  do {
    iVar1 = iVar1 * *(int *)((long)&local_50 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  local_40.total = (size_t)iVar1;
  __l._M_len = 2;
  __l._M_array = &local_50;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_40.dims,__l,&local_51);
  result = Factory<yyml::nn::Variable<double>>::GetNewInstance<yyml::TensorShape&>(&local_40);
  MM<double>(va,vb,result);
  if (local_40.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return result;
}

Assistant:

Variable<Type>* MM(Variable<Type>* va, Variable<Type>* vb) {
  size_t m = va->values_.shape().dims[0], n = vb->values_.shape().dims[1],
         p = va->values_.shape().dims[1];
  TensorShape shape = {m, n};
  auto* result = Variable<Type>::factory::GetNewInstance(shape);
  MM(va, vb, result);
  return result;
}